

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O0

void icu_63::CollationKeys::writeSortKeyUpToQuaternary
               (CollationIterator *iter,UBool *compressibleBytes,CollationSettings *settings,
               SortKeyByteSink *sink,Level minLevel,LevelCallback *callback,UBool preflight,
               UErrorCode *errorCode)

{
  char cVar1;
  uint8_t uVar2;
  uint options_00;
  UBool UVar3;
  byte bVar4;
  int32_t iVar5;
  uint uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint local_234;
  bool local_219;
  int32_t local_1fc;
  uint8_t c_1;
  int32_t i;
  uint8_t b_8;
  int32_t length;
  uint uStack_1e8;
  UBool ok;
  uint32_t b_7;
  uint32_t q_1;
  uint32_t b_6;
  uint32_t b_5;
  uint32_t b_4;
  uint32_t t;
  uint32_t b_3;
  uint32_t c;
  uint8_t b_2;
  uint8_t *r;
  uint8_t *q;
  int32_t last;
  uint8_t *secs;
  uint32_t b_1;
  int32_t remainder;
  uint32_t b;
  uint32_t s;
  uint32_t lower32;
  uint local_18c;
  char buffer [3];
  char p2;
  uint32_t p1;
  UBool isCompressible;
  ulong uStack_180;
  uint32_t p;
  int64_t ce;
  uint local_170;
  int32_t secSegmentStart;
  uint32_t prevSecondary;
  int32_t commonQuaternaries;
  int32_t commonTertiaries;
  int32_t commonSecondaries;
  int32_t commonCases;
  uint32_t prevReorderedPrimary;
  SortKeyLevel quaternaries;
  SortKeyLevel tertiaries;
  undefined1 local_c8 [8];
  SortKeyLevel secondaries;
  SortKeyLevel cases;
  uint32_t tertiaryMask;
  uint32_t variableTop;
  uint32_t levels;
  int32_t options;
  LevelCallback *callback_local;
  Level minLevel_local;
  SortKeyByteSink *sink_local;
  CollationSettings *settings_local;
  UBool *compressibleBytes_local;
  CollationIterator *iter_local;
  
  UVar3 = ::U_FAILURE(*errorCode);
  if (UVar3 != '\0') {
    return;
  }
  options_00 = settings->options;
  iVar5 = CollationSettings::getStrength(options_00);
  tertiaryMask = *(uint32_t *)(levelMasks + (long)iVar5 * 4);
  if ((options_00 & 0x400) != 0) {
    tertiaryMask = tertiaryMask | 8;
  }
  uVar6 = ((1 << ((byte)minLevel & 0x1f)) - 1U ^ 0xffffffff) & tertiaryMask;
  if (uVar6 == 0) {
    return;
  }
  if ((options_00 & 0xc) == 0) {
    cases.ok = '\0';
    cases._61_3_ = 0;
  }
  else {
    cases._60_4_ = settings->variableTop + 1;
  }
  uVar7 = CollationSettings::getTertiaryMask(options_00);
  anon_unknown_4::SortKeyLevel::SortKeyLevel((SortKeyLevel *)&secondaries.len);
  anon_unknown_4::SortKeyLevel::SortKeyLevel((SortKeyLevel *)local_c8);
  anon_unknown_4::SortKeyLevel::SortKeyLevel((SortKeyLevel *)&quaternaries.len);
  anon_unknown_4::SortKeyLevel::SortKeyLevel((SortKeyLevel *)&commonCases);
  commonSecondaries = 0;
  commonTertiaries = 0;
  commonQuaternaries = 0;
  prevSecondary = 0;
  secSegmentStart = 0;
  local_170 = 0;
  ce._4_4_ = 0;
  do {
    do {
      CollationIterator::clearCEsIfNoneRemaining(iter);
      uStack_180 = CollationIterator::nextCE(iter,errorCode);
      p1 = (uint32_t)(uStack_180 >> 0x20);
      if ((p1 < (uint)cases._60_4_) && (0x2000000 < p1)) {
        if (secSegmentStart != 0) {
          for (secSegmentStart = secSegmentStart + -1; 0x70 < secSegmentStart;
              secSegmentStart = secSegmentStart + -0x71) {
            anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&commonCases,0x8c);
          }
          anon_unknown_4::SortKeyLevel::appendByte
                    ((SortKeyLevel *)&commonCases,secSegmentStart + 0x1c);
          secSegmentStart = 0;
        }
        do {
          if ((uVar6 & 0x20) != 0) {
            UVar3 = CollationSettings::hasReordering(settings);
            if (UVar3 != '\0') {
              p1 = CollationSettings::reorder(settings,p1);
            }
            if (0x1a < p1 >> 0x18) {
              anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&commonCases,0x1b);
            }
            anon_unknown_4::SortKeyLevel::appendWeight32((SortKeyLevel *)&commonCases,p1);
          }
          do {
            uStack_180 = CollationIterator::nextCE(iter,errorCode);
            p1 = (uint32_t)(uStack_180 >> 0x20);
          } while (p1 == 0);
          local_219 = p1 < (uint)cases._60_4_ && 0x2000000 < p1;
        } while (local_219);
      }
      if ((1 < p1) && ((uVar6 & 2) != 0)) {
        cVar1 = compressibleBytes[p1._3_1_];
        UVar3 = CollationSettings::hasReordering(settings);
        if (UVar3 != '\0') {
          p1 = CollationSettings::reorder(settings,p1);
        }
        local_18c = p1 >> 0x18;
        if ((cVar1 == '\0') || (local_18c != (uint)commonSecondaries >> 0x18)) {
          if (commonSecondaries != 0) {
            if (p1 < (uint)commonSecondaries) {
              if (2 < local_18c) {
                SortKeyByteSink::Append(sink,3);
              }
            }
            else {
              SortKeyByteSink::Append(sink,0xff);
            }
          }
          SortKeyByteSink::Append(sink,local_18c);
          if (cVar1 == '\0') {
            commonSecondaries = 0;
          }
          else {
            commonSecondaries = p1;
          }
        }
        lower32._3_1_ = (char)(p1 >> 0x10);
        if (lower32._3_1_ != '\0') {
          lower32._1_1_ = (char)(p1 >> 8);
          lower32._2_1_ = (char)p1;
          if (lower32._1_1_ == '\0') {
            local_234 = 1;
          }
          else {
            local_234 = 3;
            if (lower32._2_1_ == '\0') {
              local_234 = 2;
            }
          }
          lower32._0_1_ = lower32._3_1_;
          (*(sink->super_ByteSink)._vptr_ByteSink[2])(sink,&lower32,(ulong)local_234);
        }
        if ((preflight == '\0') && (UVar3 = SortKeyByteSink::Overflowed(sink), UVar3 != '\0')) {
          UVar3 = ::U_SUCCESS(*errorCode);
          if ((UVar3 != '\0') && (UVar3 = SortKeyByteSink::IsOk(sink), UVar3 == '\0')) {
            *errorCode = U_MEMORY_ALLOCATION_ERROR;
          }
          goto LAB_0029615f;
        }
      }
      uVar8 = (uint)uStack_180;
    } while (uVar8 == 0);
    if (((uVar6 & 4) != 0) && (uVar9 = uVar8 >> 0x10, uVar9 != 0)) {
      if ((uVar9 == 0x500) && (((options_00 & 0x800) == 0 || (p1 != 0x2000000)))) {
        commonQuaternaries = commonQuaternaries + 1;
      }
      else if ((options_00 & 0x800) == 0) {
        if (commonQuaternaries != 0) {
          for (commonQuaternaries = commonQuaternaries + -1; 0x20 < commonQuaternaries;
              commonQuaternaries = commonQuaternaries + -0x21) {
            anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)local_c8,0x25);
          }
          if (uVar9 < 0x500) {
            b_1 = commonQuaternaries + 5;
          }
          else {
            b_1 = 0x45 - commonQuaternaries;
          }
          anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)local_c8,b_1);
          commonQuaternaries = 0;
        }
        anon_unknown_4::SortKeyLevel::appendWeight16((SortKeyLevel *)local_c8,uVar9);
      }
      else {
        if (commonQuaternaries != 0) {
          iVar10 = (commonQuaternaries + -1) % 0x21;
          if (local_170 < 0x500) {
            secs._0_4_ = iVar10 + 5;
          }
          else {
            secs._0_4_ = 0x45 - iVar10;
          }
          anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)local_c8,(uint32_t)secs);
          for (commonQuaternaries = (commonQuaternaries + -1) - iVar10; 0 < commonQuaternaries;
              commonQuaternaries = commonQuaternaries + -0x21) {
            anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)local_c8,0x25);
          }
        }
        if ((p1 == 0) || (0x2000000 < p1)) {
          anon_unknown_4::SortKeyLevel::appendReverseWeight16((SortKeyLevel *)local_c8,uVar9);
          local_170 = uVar9;
        }
        else {
          puVar11 = anon_unknown_4::SortKeyLevel::data((SortKeyLevel *)local_c8);
          iVar5 = anon_unknown_4::SortKeyLevel::length((SortKeyLevel *)local_c8);
          if (ce._4_4_ < iVar5 + -1) {
            _c = puVar11 + (iVar5 + -1);
            r = puVar11 + ce._4_4_;
            do {
              uVar2 = *r;
              puVar11 = r + 1;
              *r = *_c;
              puVar12 = _c + -1;
              *_c = uVar2;
              _c = puVar12;
              r = puVar11;
            } while (puVar11 < puVar12);
          }
          anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)local_c8,(p1 != 1) + 1);
          local_170 = 0;
          ce._4_4_ = anon_unknown_4::SortKeyLevel::length((SortKeyLevel *)local_c8);
        }
      }
    }
    if ((uVar6 & 8) != 0) {
      iVar5 = CollationSettings::getStrength(options_00);
      if (iVar5 == 0) {
        if (p1 != 0) {
LAB_0029578d:
          t = uVar8 >> 8 & 0xff;
          if (((uVar8 >> 8 & 0xc0) == 0) && (1 < t)) {
            commonTertiaries = commonTertiaries + 1;
          }
          else {
            if ((options_00 & 0x100) == 0) {
              if ((commonTertiaries != 0) &&
                 ((1 < t || (UVar3 = anon_unknown_4::SortKeyLevel::isEmpty
                                               ((SortKeyLevel *)&secondaries.len), UVar3 == '\0'))))
              {
                for (commonTertiaries = commonTertiaries + -1; 6 < commonTertiaries;
                    commonTertiaries = commonTertiaries + -7) {
                  anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&secondaries.len,0x70);
                }
                if (t < 2) {
                  b_4 = commonTertiaries + 1;
                }
                else {
                  b_4 = 0xd - commonTertiaries;
                }
                anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&secondaries.len,b_4 << 4);
                commonTertiaries = 0;
              }
              if (1 < t) {
                t = ((t >> 6) + 0xd) * 0x10;
              }
            }
            else {
              if (commonTertiaries != 0) {
                for (commonTertiaries = commonTertiaries + -1; 0xc < commonTertiaries;
                    commonTertiaries = commonTertiaries + -0xd) {
                  anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&secondaries.len,0x30);
                }
                anon_unknown_4::SortKeyLevel::appendByte
                          ((SortKeyLevel *)&secondaries.len,commonTertiaries * 0x10 + 0x30);
                commonTertiaries = 0;
              }
              if (1 < t) {
                t = (3 - (t >> 6)) * 0x10;
              }
            }
            anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&secondaries.len,t);
          }
        }
      }
      else if (0xffff < uVar8) goto LAB_0029578d;
    }
    if ((uVar6 & 0x10) != 0) {
      b_5 = uVar8 & uVar7;
      if (b_5 == 0x500) {
        prevSecondary = prevSecondary + 1;
      }
      else if ((uVar7 & 0x8000) == 0) {
        if (prevSecondary != 0) {
          for (prevSecondary = prevSecondary - 1; 0x60 < (int)prevSecondary;
              prevSecondary = prevSecondary - 0x61) {
            anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&quaternaries.len,0x65);
          }
          if (b_5 < 0x500) {
            b_6 = prevSecondary + 5;
          }
          else {
            b_6 = 0xc5 - prevSecondary;
          }
          anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&quaternaries.len,b_6);
          prevSecondary = 0;
        }
        if (0x500 < b_5) {
          b_5 = b_5 + 0xc000;
        }
        anon_unknown_4::SortKeyLevel::appendWeight16((SortKeyLevel *)&quaternaries.len,b_5);
      }
      else if ((options_00 & 0x100) == 0) {
        if (prevSecondary != 0) {
          for (prevSecondary = prevSecondary - 1; 0x20 < (int)prevSecondary;
              prevSecondary = prevSecondary - 0x21) {
            anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&quaternaries.len,0x25);
          }
          if (b_5 < 0x500) {
            q_1 = prevSecondary + 5;
          }
          else {
            q_1 = 0x45 - prevSecondary;
          }
          anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&quaternaries.len,q_1);
          prevSecondary = 0;
        }
        if (0x500 < b_5) {
          b_5 = b_5 + 0x4000;
        }
        anon_unknown_4::SortKeyLevel::appendWeight16((SortKeyLevel *)&quaternaries.len,b_5);
      }
      else {
        if (0x100 < b_5) {
          if (uVar8 < 0x10000) {
            b_5 = b_5 + 0x4000;
          }
          else {
            b_5 = b_5 ^ 0xc000;
            if (b_5 < 0xc500) {
              b_5 = b_5 - 0x4000;
            }
          }
        }
        if (prevSecondary != 0) {
          for (prevSecondary = prevSecondary - 1; 0x20 < (int)prevSecondary;
              prevSecondary = prevSecondary - 0x21) {
            anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&quaternaries.len,0xa5);
          }
          if (b_5 < 0x8500) {
            b_7 = prevSecondary + 0x85;
          }
          else {
            b_7 = 0xc5 - prevSecondary;
          }
          anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&quaternaries.len,b_7);
          prevSecondary = 0;
        }
        anon_unknown_4::SortKeyLevel::appendWeight16((SortKeyLevel *)&quaternaries.len,b_5);
      }
    }
    if ((uVar6 & 0x20) != 0) {
      uVar9 = uVar8 & 0xffff;
      if (((uStack_180 & 0xc0) == 0) && (0x100 < uVar9)) {
        secSegmentStart = secSegmentStart + 1;
      }
      else if ((uVar9 == 0x100) &&
              (((options_00 & 0xc) == 0 &&
               (UVar3 = anon_unknown_4::SortKeyLevel::isEmpty((SortKeyLevel *)&commonCases),
               UVar3 != '\0')))) {
        anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&commonCases,1);
      }
      else {
        if (uVar9 == 0x100) {
          uStack_1e8 = 1;
        }
        else {
          uStack_1e8 = (uVar9 >> 6 & 3) + 0xfc;
        }
        if (secSegmentStart != 0) {
          for (secSegmentStart = secSegmentStart + -1; 0x70 < secSegmentStart;
              secSegmentStart = secSegmentStart + -0x71) {
            anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&commonCases,0x8c);
          }
          if (uStack_1e8 < 0x1c) {
            length = secSegmentStart + 0x1c;
          }
          else {
            length = 0xfc - secSegmentStart;
          }
          anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&commonCases,length);
          secSegmentStart = 0;
        }
        anon_unknown_4::SortKeyLevel::appendByte((SortKeyLevel *)&commonCases,uStack_1e8);
      }
    }
  } while (uVar8 >> 0x18 != 1);
  UVar3 = ::U_FAILURE(*errorCode);
  if (UVar3 == '\0') {
    b_8 = '\x01';
    if ((uVar6 & 4) != 0) {
      iVar10 = (*callback->_vptr_LevelCallback[2])(callback,2);
      if ((char)iVar10 == '\0') goto LAB_0029615f;
      bVar4 = anon_unknown_4::SortKeyLevel::isOk((SortKeyLevel *)local_c8);
      b_8 = bVar4 & 1;
      SortKeyByteSink::Append(sink,1);
      anon_unknown_4::SortKeyLevel::appendTo((SortKeyLevel *)local_c8,&sink->super_ByteSink);
    }
    if ((uVar6 & 8) != 0) {
      iVar10 = (*callback->_vptr_LevelCallback[2])(callback,3);
      if ((char)iVar10 == '\0') goto LAB_0029615f;
      bVar4 = anon_unknown_4::SortKeyLevel::isOk((SortKeyLevel *)&secondaries.len);
      b_8 = b_8 & bVar4;
      SortKeyByteSink::Append(sink,1);
      iVar5 = anon_unknown_4::SortKeyLevel::length((SortKeyLevel *)&secondaries.len);
      c_1 = '\0';
      for (local_1fc = 0; local_1fc < iVar5 + -1; local_1fc = local_1fc + 1) {
        bVar4 = anon_unknown_4::SortKeyLevel::operator[]((SortKeyLevel *)&secondaries.len,local_1fc)
        ;
        if (c_1 != '\0') {
          SortKeyByteSink::Append(sink,(uint)(byte)(c_1 | bVar4 >> 4));
          c_1 = '\0';
          bVar4 = c_1;
        }
        c_1 = bVar4;
      }
      if (c_1 != '\0') {
        SortKeyByteSink::Append(sink,(uint)c_1);
      }
    }
    if ((uVar6 & 0x10) != 0) {
      iVar10 = (*callback->_vptr_LevelCallback[2])(callback,4);
      if ((char)iVar10 == '\0') goto LAB_0029615f;
      bVar4 = anon_unknown_4::SortKeyLevel::isOk((SortKeyLevel *)&quaternaries.len);
      b_8 = b_8 & bVar4;
      SortKeyByteSink::Append(sink,1);
      anon_unknown_4::SortKeyLevel::appendTo
                ((SortKeyLevel *)&quaternaries.len,&sink->super_ByteSink);
    }
    if ((uVar6 & 0x20) != 0) {
      iVar10 = (*callback->_vptr_LevelCallback[2])(callback,5);
      if ((char)iVar10 == '\0') goto LAB_0029615f;
      bVar4 = anon_unknown_4::SortKeyLevel::isOk((SortKeyLevel *)&commonCases);
      b_8 = b_8 & bVar4;
      SortKeyByteSink::Append(sink,1);
      anon_unknown_4::SortKeyLevel::appendTo((SortKeyLevel *)&commonCases,&sink->super_ByteSink);
    }
    if ((b_8 == '\0') || (UVar3 = SortKeyByteSink::IsOk(sink), UVar3 == '\0')) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
  }
LAB_0029615f:
  anon_unknown_4::SortKeyLevel::~SortKeyLevel((SortKeyLevel *)&commonCases);
  anon_unknown_4::SortKeyLevel::~SortKeyLevel((SortKeyLevel *)&quaternaries.len);
  anon_unknown_4::SortKeyLevel::~SortKeyLevel((SortKeyLevel *)local_c8);
  anon_unknown_4::SortKeyLevel::~SortKeyLevel((SortKeyLevel *)&secondaries.len);
  return;
}

Assistant:

void
CollationKeys::writeSortKeyUpToQuaternary(CollationIterator &iter,
                                          const UBool *compressibleBytes,
                                          const CollationSettings &settings,
                                          SortKeyByteSink &sink,
                                          Collation::Level minLevel, LevelCallback &callback,
                                          UBool preflight, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }

    int32_t options = settings.options;
    // Set of levels to process and write.
    uint32_t levels = levelMasks[CollationSettings::getStrength(options)];
    if((options & CollationSettings::CASE_LEVEL) != 0) {
        levels |= Collation::CASE_LEVEL_FLAG;
    }
    // Minus the levels below minLevel.
    levels &= ~(((uint32_t)1 << minLevel) - 1);
    if(levels == 0) { return; }

    uint32_t variableTop;
    if((options & CollationSettings::ALTERNATE_MASK) == 0) {
        variableTop = 0;
    } else {
        // +1 so that we can use "<" and primary ignorables test out early.
        variableTop = settings.variableTop + 1;
    }

    uint32_t tertiaryMask = CollationSettings::getTertiaryMask(options);

    SortKeyLevel cases;
    SortKeyLevel secondaries;
    SortKeyLevel tertiaries;
    SortKeyLevel quaternaries;

    uint32_t prevReorderedPrimary = 0;  // 0==no compression
    int32_t commonCases = 0;
    int32_t commonSecondaries = 0;
    int32_t commonTertiaries = 0;
    int32_t commonQuaternaries = 0;

    uint32_t prevSecondary = 0;
    int32_t secSegmentStart = 0;

    for(;;) {
        // No need to keep all CEs in the buffer when we write a sort key.
        iter.clearCEsIfNoneRemaining();
        int64_t ce = iter.nextCE(errorCode);
        uint32_t p = (uint32_t)(ce >> 32);
        if(p < variableTop && p > Collation::MERGE_SEPARATOR_PRIMARY) {
            // Variable CE, shift it to quaternary level.
            // Ignore all following primary ignorables, and shift further variable CEs.
            if(commonQuaternaries != 0) {
                --commonQuaternaries;
                while(commonQuaternaries >= QUAT_COMMON_MAX_COUNT) {
                    quaternaries.appendByte(QUAT_COMMON_MIDDLE);
                    commonQuaternaries -= QUAT_COMMON_MAX_COUNT;
                }
                // Shifted primary weights are lower than the common weight.
                quaternaries.appendByte(QUAT_COMMON_LOW + commonQuaternaries);
                commonQuaternaries = 0;
            }
            do {
                if((levels & Collation::QUATERNARY_LEVEL_FLAG) != 0) {
                    if(settings.hasReordering()) {
                        p = settings.reorder(p);
                    }
                    if((p >> 24) >= QUAT_SHIFTED_LIMIT_BYTE) {
                        // Prevent shifted primary lead bytes from
                        // overlapping with the common compression range.
                        quaternaries.appendByte(QUAT_SHIFTED_LIMIT_BYTE);
                    }
                    quaternaries.appendWeight32(p);
                }
                do {
                    ce = iter.nextCE(errorCode);
                    p = (uint32_t)(ce >> 32);
                } while(p == 0);
            } while(p < variableTop && p > Collation::MERGE_SEPARATOR_PRIMARY);
        }
        // ce could be primary ignorable, or NO_CE, or the merge separator,
        // or a regular primary CE, but it is not variable.
        // If ce==NO_CE, then write nothing for the primary level but
        // terminate compression on all levels and then exit the loop.
        if(p > Collation::NO_CE_PRIMARY && (levels & Collation::PRIMARY_LEVEL_FLAG) != 0) {
            // Test the un-reordered primary for compressibility.
            UBool isCompressible = compressibleBytes[p >> 24];
            if(settings.hasReordering()) {
                p = settings.reorder(p);
            }
            uint32_t p1 = p >> 24;
            if(!isCompressible || p1 != (prevReorderedPrimary >> 24)) {
                if(prevReorderedPrimary != 0) {
                    if(p < prevReorderedPrimary) {
                        // No primary compression terminator
                        // at the end of the level or merged segment.
                        if(p1 > Collation::MERGE_SEPARATOR_BYTE) {
                            sink.Append(Collation::PRIMARY_COMPRESSION_LOW_BYTE);
                        }
                    } else {
                        sink.Append(Collation::PRIMARY_COMPRESSION_HIGH_BYTE);
                    }
                }
                sink.Append(p1);
                if(isCompressible) {
                    prevReorderedPrimary = p;
                } else {
                    prevReorderedPrimary = 0;
                }
            }
            char p2 = (char)(p >> 16);
            if(p2 != 0) {
                char buffer[3] = { p2, (char)(p >> 8), (char)p };
                sink.Append(buffer, (buffer[1] == 0) ? 1 : (buffer[2] == 0) ? 2 : 3);
            }
            // Optimization for internalNextSortKeyPart():
            // When the primary level overflows we can stop because we need not
            // calculate (preflight) the whole sort key length.
            if(!preflight && sink.Overflowed()) {
                if(U_SUCCESS(errorCode) && !sink.IsOk()) {
                    errorCode = U_MEMORY_ALLOCATION_ERROR;
                }
                return;
            }
        }

        uint32_t lower32 = (uint32_t)ce;
        if(lower32 == 0) { continue; }  // completely ignorable, no secondary/case/tertiary/quaternary

        if((levels & Collation::SECONDARY_LEVEL_FLAG) != 0) {
            uint32_t s = lower32 >> 16;
            if(s == 0) {
                // secondary ignorable
            } else if(s == Collation::COMMON_WEIGHT16 &&
                    ((options & CollationSettings::BACKWARD_SECONDARY) == 0 ||
                        p != Collation::MERGE_SEPARATOR_PRIMARY)) {
                // s is a common secondary weight, and
                // backwards-secondary is off or the ce is not the merge separator.
                ++commonSecondaries;
            } else if((options & CollationSettings::BACKWARD_SECONDARY) == 0) {
                if(commonSecondaries != 0) {
                    --commonSecondaries;
                    while(commonSecondaries >= SEC_COMMON_MAX_COUNT) {
                        secondaries.appendByte(SEC_COMMON_MIDDLE);
                        commonSecondaries -= SEC_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(s < Collation::COMMON_WEIGHT16) {
                        b = SEC_COMMON_LOW + commonSecondaries;
                    } else {
                        b = SEC_COMMON_HIGH - commonSecondaries;
                    }
                    secondaries.appendByte(b);
                    commonSecondaries = 0;
                }
                secondaries.appendWeight16(s);
            } else {
                if(commonSecondaries != 0) {
                    --commonSecondaries;
                    // Append reverse weights. The level will be re-reversed later.
                    int32_t remainder = commonSecondaries % SEC_COMMON_MAX_COUNT;
                    uint32_t b;
                    if(prevSecondary < Collation::COMMON_WEIGHT16) {
                        b = SEC_COMMON_LOW + remainder;
                    } else {
                        b = SEC_COMMON_HIGH - remainder;
                    }
                    secondaries.appendByte(b);
                    commonSecondaries -= remainder;
                    // commonSecondaries is now a multiple of SEC_COMMON_MAX_COUNT.
                    while(commonSecondaries > 0) {  // same as >= SEC_COMMON_MAX_COUNT
                        secondaries.appendByte(SEC_COMMON_MIDDLE);
                        commonSecondaries -= SEC_COMMON_MAX_COUNT;
                    }
                    // commonSecondaries == 0
                }
                if(0 < p && p <= Collation::MERGE_SEPARATOR_PRIMARY) {
                    // The backwards secondary level compares secondary weights backwards
                    // within segments separated by the merge separator (U+FFFE).
                    uint8_t *secs = secondaries.data();
                    int32_t last = secondaries.length() - 1;
                    if(secSegmentStart < last) {
                        uint8_t *q = secs + secSegmentStart;
                        uint8_t *r = secs + last;
                        do {
                            uint8_t b = *q;
                            *q++ = *r;
                            *r-- = b;
                        } while(q < r);
                    }
                    secondaries.appendByte(p == Collation::NO_CE_PRIMARY ?
                        Collation::LEVEL_SEPARATOR_BYTE : Collation::MERGE_SEPARATOR_BYTE);
                    prevSecondary = 0;
                    secSegmentStart = secondaries.length();
                } else {
                    secondaries.appendReverseWeight16(s);
                    prevSecondary = s;
                }
            }
        }

        if((levels & Collation::CASE_LEVEL_FLAG) != 0) {
            if((CollationSettings::getStrength(options) == UCOL_PRIMARY) ?
                    p == 0 : lower32 <= 0xffff) {
                // Primary+caseLevel: Ignore case level weights of primary ignorables.
                // Otherwise: Ignore case level weights of secondary ignorables.
                // For details see the comments in the CollationCompare class.
            } else {
                uint32_t c = (lower32 >> 8) & 0xff;  // case bits & tertiary lead byte
                U_ASSERT((c & 0xc0) != 0xc0);
                if((c & 0xc0) == 0 && c > Collation::LEVEL_SEPARATOR_BYTE) {
                    ++commonCases;
                } else {
                    if((options & CollationSettings::UPPER_FIRST) == 0) {
                        // lowerFirst: Compress common weights to nibbles 1..7..13, mixed=14, upper=15.
                        // If there are only common (=lowest) weights in the whole level,
                        // then we need not write anything.
                        // Level length differences are handled already on the next-higher level.
                        if(commonCases != 0 &&
                                (c > Collation::LEVEL_SEPARATOR_BYTE || !cases.isEmpty())) {
                            --commonCases;
                            while(commonCases >= CASE_LOWER_FIRST_COMMON_MAX_COUNT) {
                                cases.appendByte(CASE_LOWER_FIRST_COMMON_MIDDLE << 4);
                                commonCases -= CASE_LOWER_FIRST_COMMON_MAX_COUNT;
                            }
                            uint32_t b;
                            if(c <= Collation::LEVEL_SEPARATOR_BYTE) {
                                b = CASE_LOWER_FIRST_COMMON_LOW + commonCases;
                            } else {
                                b = CASE_LOWER_FIRST_COMMON_HIGH - commonCases;
                            }
                            cases.appendByte(b << 4);
                            commonCases = 0;
                        }
                        if(c > Collation::LEVEL_SEPARATOR_BYTE) {
                            c = (CASE_LOWER_FIRST_COMMON_HIGH + (c >> 6)) << 4;  // 14 or 15
                        }
                    } else {
                        // upperFirst: Compress common weights to nibbles 3..15, mixed=2, upper=1.
                        // The compressed common case weights only go up from the "low" value
                        // because with upperFirst the common weight is the highest one.
                        if(commonCases != 0) {
                            --commonCases;
                            while(commonCases >= CASE_UPPER_FIRST_COMMON_MAX_COUNT) {
                                cases.appendByte(CASE_UPPER_FIRST_COMMON_LOW << 4);
                                commonCases -= CASE_UPPER_FIRST_COMMON_MAX_COUNT;
                            }
                            cases.appendByte((CASE_UPPER_FIRST_COMMON_LOW + commonCases) << 4);
                            commonCases = 0;
                        }
                        if(c > Collation::LEVEL_SEPARATOR_BYTE) {
                            c = (CASE_UPPER_FIRST_COMMON_LOW - (c >> 6)) << 4;  // 2 or 1
                        }
                    }
                    // c is a separator byte 01,
                    // or a left-shifted nibble 0x10, 0x20, ... 0xf0.
                    cases.appendByte(c);
                }
            }
        }

        if((levels & Collation::TERTIARY_LEVEL_FLAG) != 0) {
            uint32_t t = lower32 & tertiaryMask;
            U_ASSERT((lower32 & 0xc000) != 0xc000);
            if(t == Collation::COMMON_WEIGHT16) {
                ++commonTertiaries;
            } else if((tertiaryMask & 0x8000) == 0) {
                // Tertiary weights without case bits.
                // Move lead bytes 06..3F to C6..FF for a large common-weight range.
                if(commonTertiaries != 0) {
                    --commonTertiaries;
                    while(commonTertiaries >= TER_ONLY_COMMON_MAX_COUNT) {
                        tertiaries.appendByte(TER_ONLY_COMMON_MIDDLE);
                        commonTertiaries -= TER_ONLY_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(t < Collation::COMMON_WEIGHT16) {
                        b = TER_ONLY_COMMON_LOW + commonTertiaries;
                    } else {
                        b = TER_ONLY_COMMON_HIGH - commonTertiaries;
                    }
                    tertiaries.appendByte(b);
                    commonTertiaries = 0;
                }
                if(t > Collation::COMMON_WEIGHT16) { t += 0xc000; }
                tertiaries.appendWeight16(t);
            } else if((options & CollationSettings::UPPER_FIRST) == 0) {
                // Tertiary weights with caseFirst=lowerFirst.
                // Move lead bytes 06..BF to 46..FF for the common-weight range.
                if(commonTertiaries != 0) {
                    --commonTertiaries;
                    while(commonTertiaries >= TER_LOWER_FIRST_COMMON_MAX_COUNT) {
                        tertiaries.appendByte(TER_LOWER_FIRST_COMMON_MIDDLE);
                        commonTertiaries -= TER_LOWER_FIRST_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(t < Collation::COMMON_WEIGHT16) {
                        b = TER_LOWER_FIRST_COMMON_LOW + commonTertiaries;
                    } else {
                        b = TER_LOWER_FIRST_COMMON_HIGH - commonTertiaries;
                    }
                    tertiaries.appendByte(b);
                    commonTertiaries = 0;
                }
                if(t > Collation::COMMON_WEIGHT16) { t += 0x4000; }
                tertiaries.appendWeight16(t);
            } else {
                // Tertiary weights with caseFirst=upperFirst.
                // Do not change the artificial uppercase weight of a tertiary CE (0.0.ut),
                // to keep tertiary CEs well-formed.
                // Their case+tertiary weights must be greater than those of
                // primary and secondary CEs.
                //
                // Separator         01 -> 01      (unchanged)
                // Lowercase     02..04 -> 82..84  (includes uncased)
                // Common weight     05 -> 85..C5  (common-weight compression range)
                // Lowercase     06..3F -> C6..FF
                // Mixed case    42..7F -> 42..7F
                // Uppercase     82..BF -> 02..3F
                // Tertiary CE   86..BF -> C6..FF
                if(t <= Collation::NO_CE_WEIGHT16) {
                    // Keep separators unchanged.
                } else if(lower32 > 0xffff) {
                    // Invert case bits of primary & secondary CEs.
                    t ^= 0xc000;
                    if(t < (TER_UPPER_FIRST_COMMON_HIGH << 8)) {
                        t -= 0x4000;
                    }
                } else {
                    // Keep uppercase bits of tertiary CEs.
                    U_ASSERT(0x8600 <= t && t <= 0xbfff);
                    t += 0x4000;
                }
                if(commonTertiaries != 0) {
                    --commonTertiaries;
                    while(commonTertiaries >= TER_UPPER_FIRST_COMMON_MAX_COUNT) {
                        tertiaries.appendByte(TER_UPPER_FIRST_COMMON_MIDDLE);
                        commonTertiaries -= TER_UPPER_FIRST_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(t < (TER_UPPER_FIRST_COMMON_LOW << 8)) {
                        b = TER_UPPER_FIRST_COMMON_LOW + commonTertiaries;
                    } else {
                        b = TER_UPPER_FIRST_COMMON_HIGH - commonTertiaries;
                    }
                    tertiaries.appendByte(b);
                    commonTertiaries = 0;
                }
                tertiaries.appendWeight16(t);
            }
        }

        if((levels & Collation::QUATERNARY_LEVEL_FLAG) != 0) {
            uint32_t q = lower32 & 0xffff;
            if((q & 0xc0) == 0 && q > Collation::NO_CE_WEIGHT16) {
                ++commonQuaternaries;
            } else if(q == Collation::NO_CE_WEIGHT16 &&
                    (options & CollationSettings::ALTERNATE_MASK) == 0 &&
                    quaternaries.isEmpty()) {
                // If alternate=non-ignorable and there are only common quaternary weights,
                // then we need not write anything.
                // The only weights greater than the merge separator and less than the common weight
                // are shifted primary weights, which are not generated for alternate=non-ignorable.
                // There are also exactly as many quaternary weights as tertiary weights,
                // so level length differences are handled already on tertiary level.
                // Any above-common quaternary weight will compare greater regardless.
                quaternaries.appendByte(Collation::LEVEL_SEPARATOR_BYTE);
            } else {
                if(q == Collation::NO_CE_WEIGHT16) {
                    q = Collation::LEVEL_SEPARATOR_BYTE;
                } else {
                    q = 0xfc + ((q >> 6) & 3);
                }
                if(commonQuaternaries != 0) {
                    --commonQuaternaries;
                    while(commonQuaternaries >= QUAT_COMMON_MAX_COUNT) {
                        quaternaries.appendByte(QUAT_COMMON_MIDDLE);
                        commonQuaternaries -= QUAT_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(q < QUAT_COMMON_LOW) {
                        b = QUAT_COMMON_LOW + commonQuaternaries;
                    } else {
                        b = QUAT_COMMON_HIGH - commonQuaternaries;
                    }
                    quaternaries.appendByte(b);
                    commonQuaternaries = 0;
                }
                quaternaries.appendByte(q);
            }
        }

        if((lower32 >> 24) == Collation::LEVEL_SEPARATOR_BYTE) { break; }  // ce == NO_CE
    }

    if(U_FAILURE(errorCode)) { return; }

    // Append the beyond-primary levels.
    UBool ok = TRUE;
    if((levels & Collation::SECONDARY_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::SECONDARY_LEVEL)) { return; }
        ok &= secondaries.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        secondaries.appendTo(sink);
    }

    if((levels & Collation::CASE_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::CASE_LEVEL)) { return; }
        ok &= cases.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        // Write pairs of nibbles as bytes, except separator bytes as themselves.
        int32_t length = cases.length() - 1;  // Ignore the trailing NO_CE.
        uint8_t b = 0;
        for(int32_t i = 0; i < length; ++i) {
            uint8_t c = (uint8_t)cases[i];
            U_ASSERT((c & 0xf) == 0 && c != 0);
            if(b == 0) {
                b = c;
            } else {
                sink.Append(b | (c >> 4));
                b = 0;
            }
        }
        if(b != 0) {
            sink.Append(b);
        }
    }

    if((levels & Collation::TERTIARY_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::TERTIARY_LEVEL)) { return; }
        ok &= tertiaries.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        tertiaries.appendTo(sink);
    }

    if((levels & Collation::QUATERNARY_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::QUATERNARY_LEVEL)) { return; }
        ok &= quaternaries.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        quaternaries.appendTo(sink);
    }

    if(!ok || !sink.IsOk()) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
}